

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O2

int trico_write_attributes_double(void *a,double *attrib,uint32_t nr_of_attribs)

{
  ssize_t sVar1;
  int iVar2;
  uint8_t header;
  uint32_t nr_of_compressed_bytes;
  uint32_t nr_of_attribs_local;
  uint8_t *compressed;
  
  header = '\x10';
  nr_of_attribs_local = nr_of_attribs;
  sVar1 = write((int)&header,(void *)0x1,1);
  iVar2 = 0;
  if ((int)sVar1 != 0) {
    sVar1 = write((int)&nr_of_attribs_local,(void *)0x4,1);
    if ((int)sVar1 != 0) {
      trico_compress_double_precision
                (&nr_of_compressed_bytes,&compressed,attrib,nr_of_attribs,0x14,0x14);
      sVar1 = write((int)&nr_of_compressed_bytes,(void *)0x4,1);
      iVar2 = 0;
      if ((int)sVar1 != 0) {
        sVar1 = write((int)compressed,(void *)0x1,(ulong)nr_of_compressed_bytes);
        if ((int)sVar1 != 0) {
          free(compressed);
          iVar2 = 1;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int trico_write_attributes_double(void* a, const double* attrib, uint32_t nr_of_attribs)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  uint8_t header = (uint8_t)trico_attribute_double_stream;
  if (!write(&header, 1, 1, arch))
    return 0;
  if (!write(&nr_of_attribs, sizeof(uint32_t), 1, arch))
    return 0;

  uint32_t nr_of_compressed_bytes;
  uint8_t* compressed;
  trico_compress_double_precision(&nr_of_compressed_bytes, &compressed, attrib, nr_of_attribs, 20, 20);

  if (!write(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  trico_free(compressed);

  return 1;
  }